

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

bool __thiscall
dxil_spv::Converter::Impl::get_uav_image_format
          (Impl *this,ResourceKind resource_kind,ComponentType actual_component_type,
          AccessTracking *access_meta,ImageFormat *format)

{
  Builder *pBVar1;
  LoggingCallback p_Var2;
  void *pvVar3;
  bool bVar4;
  char buffer [4096];
  Capability local_1018 [1024];
  
  if ((byte)(resource_kind - FeedbackTexture2D) < 2) {
    *format = ImageFormatR64ui;
    pBVar1 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addExtension(pBVar1,"SPV_EXT_shader_image_int64");
    pBVar1 = SPIRVModule::get_builder(this->spirv_module);
    local_1018[0] = CapabilityInt64ImageEXT;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar1->capabilities,local_1018);
    bVar4 = true;
  }
  else {
    bVar4 = true;
    if (((byte)(resource_kind - CBuffer) < 0xfe) && (access_meta->has_read == true)) {
      if (((this->options).typed_uav_read_without_format == true) &&
         (access_meta->has_atomic == false)) {
        pBVar1 = SPIRVModule::get_builder(this->spirv_module);
        local_1018[0] = CapabilityStorageImageReadWithoutFormat;
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)&pBVar1->capabilities,local_1018);
        *format = ImageFormatUnknown;
      }
      else {
        switch(actual_component_type) {
        case I32:
          *format = ImageFormatR32i;
          break;
        case U32:
          *format = ImageFormatR32ui;
          break;
        default:
          p_Var2 = get_thread_log_callback();
          if (p_Var2 == (LoggingCallback)0x0) {
            get_uav_image_format();
          }
          else {
            memcpy(local_1018,
                   "Reading from UAV, but component type does not conform to U32, I32, F32 or U64. typed_uav_read_without_format option must be enabled.\n"
                   ,0x86);
            pvVar3 = get_thread_log_callback_userdata();
            (*p_Var2)(pvVar3,Error,(char *)local_1018);
          }
          bVar4 = false;
          break;
        case U64:
          *format = ImageFormatR64ui;
          pBVar1 = SPIRVModule::get_builder(this->spirv_module);
          spv::Builder::addExtension(pBVar1,"SPV_EXT_shader_image_int64");
          pBVar1 = SPIRVModule::get_builder(this->spirv_module);
          local_1018[0] = CapabilityInt64ImageEXT;
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                      *)&pBVar1->capabilities,local_1018);
          break;
        case F32:
          *format = ImageFormatR32f;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool Converter::Impl::get_uav_image_format(DXIL::ResourceKind resource_kind,
                                           DXIL::ComponentType actual_component_type,
                                           const AccessTracking &access_meta,
                                           spv::ImageFormat &format)
{
	if (resource_kind == DXIL::ResourceKind::FeedbackTexture2D ||
	    resource_kind == DXIL::ResourceKind::FeedbackTexture2DArray)
	{
		format = spv::ImageFormatR64ui;
		builder().addExtension("SPV_EXT_shader_image_int64");
		builder().addCapability(spv::CapabilityInt64ImageEXT);
		return true;
	}
	else if (resource_kind != DXIL::ResourceKind::RawBuffer &&
	         resource_kind != DXIL::ResourceKind::StructuredBuffer)
	{
		// For any typed resource, we need to check if the resource is being read.
		// To avoid StorageReadWithoutFormat, we emit a format based on the component type.
		if (access_meta.has_read)
		{
			if (options.typed_uav_read_without_format && !access_meta.has_atomic)
			{
				builder().addCapability(spv::CapabilityStorageImageReadWithoutFormat);
				format = spv::ImageFormatUnknown;
			}
			else
			{
				switch (actual_component_type)
				{
				case DXIL::ComponentType::U32:
					format = spv::ImageFormatR32ui;
					break;

				case DXIL::ComponentType::I32:
					format = spv::ImageFormatR32i;
					break;

				case DXIL::ComponentType::F32:
					format = spv::ImageFormatR32f;
					break;

				case DXIL::ComponentType::U64:
					format = spv::ImageFormatR64ui;
					builder().addExtension("SPV_EXT_shader_image_int64");
					builder().addCapability(spv::CapabilityInt64ImageEXT);
					break;

				default:
					LOGE("Reading from UAV, but component type does not conform to U32, I32, F32 or U64. "
					     "typed_uav_read_without_format option must be enabled.\n");
					return false;
				}
			}
		}
	}

	return true;
}